

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomType.cpp
# Opt level: O2

void __thiscall
OpenMD::AtomType::addProperty(AtomType *this,shared_ptr<OpenMD::GenericData> *genData)

{
  mapped_type_conflict1 *pmVar1;
  __shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> local_50;
  key_type local_40;
  
  std::__cxx11::string::string
            ((string *)&local_40,
             (string *)
             &((genData->super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              )->id_);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ::operator[](&this->myResponsibilities_,&local_40);
  *pmVar1 = true;
  std::__cxx11::string::~string((string *)&local_40);
  std::__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,&genData->super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>
            );
  PropertyMap::addProperty(&this->properties_,(shared_ptr<OpenMD::GenericData> *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  return;
}

Assistant:

void AtomType::addProperty(std::shared_ptr<GenericData> genData) {
    myResponsibilities_[genData->getID()] = true;
    properties_.addProperty(genData);
  }